

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::RegisterMemory
          (StandardBufferManager *this,MemoryTag tag,idx_t block_size,idx_t block_header_size,
          bool can_destroy)

{
  atomic<long> *paVar1;
  type __args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined7 in_register_00000031;
  StandardBufferManager *pSVar3;
  undefined7 in_register_00000081;
  StringUtil *this_00;
  shared_ptr<duckdb::BlockHandle,_true> sVar4;
  DestroyBufferUpon destroy_buffer_upon;
  MemoryTag tag_local;
  undefined1 local_a9;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_a8 [2];
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_98;
  StandardBufferManager *local_90;
  idx_t alloc_size;
  shared_ptr<duckdb::BlockHandle> local_80;
  long local_70;
  TempBufferPoolReservation res;
  string local_50;
  
  pSVar3 = (StandardBufferManager *)CONCAT71(in_register_00000031,tag);
  this_00 = (StringUtil *)
            (block_header_size + CONCAT71(in_register_00000081,can_destroy) + 0xfff &
            0xfffffffffffff000);
  local_a8[0]._M_head_impl = (FileBuffer *)0x0;
  tag_local = (MemoryTag)block_size;
  local_90 = this;
  alloc_size = (idx_t)this_00;
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,this_00,0x400,block_header_size);
  EvictBlocksOrThrow<char_const*,std::__cxx11::string>
            (&res,pSVar3,(MemoryTag)block_size,(idx_t)this_00,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
             local_a8,"could not allocate block of size %s%s",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (*(pSVar3->super_BufferManager)._vptr_BufferManager[0x1e])
            (&local_98,pSVar3,block_header_size,CONCAT71(in_register_00000081,can_destroy),local_a8,
             2);
  __args = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
           operator*(&pSVar3->temp_block_manager);
  LOCK();
  paVar1 = &pSVar3->temporary_id;
  local_70 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_70 = local_70 + 1;
  local_80.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::BlockHandle,std::allocator<duckdb::BlockHandle>,duckdb::BlockManager&,long,duckdb::MemoryTag&,duckdb::unique_ptr<duckdb::FileBuffer,std::default_delete<duckdb::FileBuffer>,true>,duckdb::DestroyBufferUpon&,unsigned_long&,duckdb::TempBufferPoolReservation>
            (&local_80.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(BlockHandle **)&local_80,(allocator<duckdb::BlockHandle> *)&local_a9,
             __args,&local_70,&tag_local,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
             &local_98,&destroy_buffer_upon,&alloc_size,&res);
  pSVar3 = local_90;
  shared_ptr<duckdb::BlockHandle,_true>::shared_ptr
            ((shared_ptr<duckdb::BlockHandle,_true> *)local_90,&local_80);
  if (local_80.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98._M_head_impl != (FileBuffer *)0x0) {
    (*(local_98._M_head_impl)->_vptr_FileBuffer[1])();
  }
  TempBufferPoolReservation::~TempBufferPoolReservation(&res);
  _Var2._M_pi = extraout_RDX;
  if (local_a8[0]._M_head_impl != (FileBuffer *)0x0) {
    (*(local_a8[0]._M_head_impl)->_vptr_FileBuffer[1])();
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pSVar3;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar4.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::RegisterMemory(MemoryTag tag, idx_t block_size, idx_t block_header_size,
                                                              bool can_destroy) {
	auto alloc_size = GetAllocSize(block_size + block_header_size);

	// Evict blocks until there is enough memory to store the buffer.
	unique_ptr<FileBuffer> reusable_buffer;
	auto res = EvictBlocksOrThrow(tag, alloc_size, &reusable_buffer, "could not allocate block of size %s%s",
	                              StringUtil::BytesToHumanReadableString(alloc_size));

	// Create a new buffer and a block to hold the buffer.
	auto buffer = ConstructManagedBuffer(block_size, block_header_size, std::move(reusable_buffer),
	                                     FileBufferType::MANAGED_BUFFER);
	DestroyBufferUpon destroy_buffer_upon = can_destroy ? DestroyBufferUpon::EVICTION : DestroyBufferUpon::BLOCK;
	return make_shared_ptr<BlockHandle>(*temp_block_manager, ++temporary_id, tag, std::move(buffer),
	                                    destroy_buffer_upon, alloc_size, std::move(res));
}